

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<bool> __thiscall kj::HttpServer::Connection::startLoop(Connection *this)

{
  Coroutine<bool> *this_00;
  Connection *this_01;
  PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *__return_storage_ptr__;
  PromiseArenaMember *node;
  SourceLocation location;
  bool bVar1;
  LoopResult LVar2;
  coroutine_handle<void> coroutine;
  Fault f;
  DebugComparison<kj::HttpServer::Connection::LoopResult_&,_kj::HttpServer::Connection::LoopResult>
  _kjCondition;
  Fault local_68;
  undefined1 local_60 [16];
  char *local_50;
  size_t local_48;
  bool local_40;
  
  coroutine._M_fr_ptr = operator_new(0x400);
  *(code **)coroutine._M_fr_ptr = startLoop;
  *(code **)((long)coroutine._M_fr_ptr + 8) = startLoop;
  this_00 = (Coroutine<bool> *)((long)coroutine._M_fr_ptr + 0x10);
  local_60._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  local_60._8_8_ = "startLoop";
  local_50 = (char *)0x1500001cea;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_006dbbe8;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006dbc30;
  location.function = "startLoop";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x1cea;
  location.columnNumber = 0x15;
  kj::_::CoroutineBase::CoroutineBase
            ((CoroutineBase *)this_00,coroutine,
             (ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98),location);
  this_01 = (Connection *)((long)coroutine._M_fr_ptr + 0x3f0);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_006dbbe8;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006dbc30;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  (this->super_Response)._vptr_Response = (_func_int **)this_00;
  startLoopImpl(this_01);
  __return_storage_ptr__ =
       (PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *)((long)coroutine._M_fr_ptr + 0x238)
  ;
  co_await<kj::HttpServer::Connection::LoopResult>
            (__return_storage_ptr__,(Promise<kj::HttpServer::Connection::LoopResult> *)this_01);
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x3fc) = 0;
  bVar1 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                    ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
  if (!bVar1) {
    LVar2 = kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::await_resume
                      (__return_storage_ptr__);
    if (*(char *)((long)coroutine._M_fr_ptr + 0x250) == '\x01') {
      Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 600));
    }
    kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)__return_storage_ptr__);
    node = (PromiseArenaMember *)(this_01->super_Response)._vptr_Response;
    if (node != (PromiseArenaMember *)0x0) {
      (this_01->super_Response)._vptr_Response = (_func_int **)0x0;
      kj::_::PromiseDisposer::dispose(node);
    }
    local_60._0_8_ = (long)coroutine._M_fr_ptr + 0x3f8;
    *(LoopResult *)local_60._0_8_ = LVar2;
    local_60._8_8_ = local_60._8_8_ & 0xffffffff00000000;
    local_50 = " != ";
    local_48 = 5;
    local_40 = LVar2 != CONTINUE_LOOP;
    if (LVar2 == CONTINUE_LOOP) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<kj::HttpServer::Connection::LoopResult&,kj::HttpServer::Connection::LoopResult>&>
                (&local_68,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x1cec,FAILED,"result != CONTINUE_LOOP","_kjCondition,",
                 (DebugComparison<kj::HttpServer::Connection::LoopResult_&,_kj::HttpServer::Connection::LoopResult>
                  *)local_60);
      kj::_::Debug::Fault::fatal(&local_68);
    }
    *(FixVoid<bool> *)((long)coroutine._M_fr_ptr + 0x3fd) = LVar2 == BREAK_LOOP_CONN_OK;
    kj::_::Coroutine<bool>::fulfill(this_00,(FixVoid<bool> *)((long)coroutine._M_fr_ptr + 0x3fd));
    *(undefined8 *)coroutine._M_fr_ptr = 0;
    *(undefined1 *)((long)coroutine._M_fr_ptr + 0x3fc) = 1;
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<bool> startLoop() {
    auto result = co_await startLoopImpl();
    KJ_ASSERT(result != CONTINUE_LOOP);
    co_return result == BREAK_LOOP_CONN_OK ? true : false;
  }